

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::ComputeTestListForRerunFailed(cmCTestTestHandler *this)

{
  bool bVar1;
  reference __x;
  size_type sVar2;
  cmCTestTestProperties *tp;
  iterator __end1;
  iterator __begin1;
  ListOfTests *__range1;
  undefined1 local_28 [4];
  int cnt;
  ListOfTests finalList;
  cmCTestTestHandler *this_local;
  
  finalList.
  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ExpandTestsToRunInformationForRerunFailed(this);
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::vector((vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            *)local_28);
  __range1._4_4_ = 0;
  __end1 = std::
           vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ::begin(&this->TestList);
  tp = (cmCTestTestProperties *)
       std::
       vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
       ::end(&this->TestList);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                                     *)&tp), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
          ::operator*(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->TestsToRun);
    if ((bVar1) ||
       (bVar1 = ::cm::contains<std::vector<int,_std::allocator<int>_>,_int,_0>
                          (&this->TestsToRun,(int *)((long)&__range1 + 4)), bVar1)) {
      __x->Index = __range1._4_4_;
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::push_back((vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                   *)local_28,__x);
    }
    __gnu_cxx::
    __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
    ::operator++(&__end1);
  }
  UpdateForFixtures(this,(ListOfTests *)local_28);
  sVar2 = std::
          vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
          ::size(&this->TestList);
  this->TotalNumberOfTests = sVar2;
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::operator=(&this->TestList,
              (vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               *)local_28);
  UpdateMaxTestNameWidth(this);
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::~vector((vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             *)local_28);
  return;
}

Assistant:

void cmCTestTestHandler::ComputeTestListForRerunFailed()
{
  this->ExpandTestsToRunInformationForRerunFailed();

  ListOfTests finalList;
  int cnt = 0;
  for (cmCTestTestProperties& tp : this->TestList) {
    cnt++;

    // if this test is not in our list of tests to run, then skip it.
    if (!this->TestsToRun.empty() && !cm::contains(this->TestsToRun, cnt)) {
      continue;
    }

    tp.Index = cnt;
    finalList.push_back(tp);
  }

  this->UpdateForFixtures(finalList);

  // Save the total number of tests before exclusions
  this->TotalNumberOfTests = this->TestList.size();

  // Set the TestList to the list of failed tests to rerun
  this->TestList = finalList;

  this->UpdateMaxTestNameWidth();
}